

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O3

OLECHAR __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::PeekNextChar(Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  byte bVar1;
  char16 cVar2;
  byte *local_10;
  
  local_10 = this->m_currentCharacter;
  if (this->m_pchLast <= local_10) {
    return L'\0';
  }
  bVar1 = *local_10;
  if (-1 < (char)bVar1) {
    return (ushort)bVar1;
  }
  local_10 = local_10 + 1;
  cVar2 = utf8::DecodeTail((ushort)bVar1,&local_10,this->m_pchLast,
                           &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions,(bool *)0x0)
  ;
  return cVar2;
}

Assistant:

OLECHAR PeekNextChar(void)
    {
        return this->PeekFull(m_currentCharacter, m_pchLast);
    }